

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

deUint32 tcu::astc::anon_unknown_0::bitReplicationScale(deUint32 src,int numSrcBits,int numDstBits)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = -numDstBits;
  iVar2 = numDstBits - numSrcBits;
  uVar1 = 0;
  while( true ) {
    iVar3 = numSrcBits + iVar3;
    if (iVar2 == -numSrcBits || SBORROW4(iVar2,-numSrcBits) != iVar2 + numSrcBits < 0) break;
    uVar4 = src >> ((byte)iVar3 & 0x1f);
    if (-1 < iVar2) {
      uVar4 = src << ((byte)iVar2 & 0x1f);
    }
    uVar1 = uVar1 | uVar4;
    iVar2 = iVar2 - numSrcBits;
  }
  return uVar1;
}

Assistant:

inline deUint32 bitReplicationScale (deUint32 src, int numSrcBits, int numDstBits)
{
	DE_ASSERT(numSrcBits <= numDstBits);
	DE_ASSERT((src & ((1<<numSrcBits)-1)) == src);
	deUint32 dst = 0;
	for (int shift = numDstBits-numSrcBits; shift > -numSrcBits; shift -= numSrcBits)
		dst |= shift >= 0 ? src << shift : src >> -shift;
	return dst;
}